

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O0

void readNumArrHelper<std::vector<long_double,std::allocator<long_double>>,long_double>
               (IniProcessing *self,char *key,
               vector<long_double,_std::allocator<long_double>_> *dest,
               vector<long_double,_std::allocator<long_double>_> *defVal)

{
  pointer ppVar1;
  value_type_conflict8 local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_38;
  iterator e;
  bool ok;
  vector<long_double,_std::allocator<long_double>_> *defVal_local;
  vector<long_double,_std::allocator<long_double>_> *dest_local;
  char *key_local;
  IniProcessing *self_local;
  
  e.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  ._M_cur._7_1_ = 0;
  local_38._M_cur =
       (__node_type *)
       IniProcessing_readHelper_abi_cxx11_
                 (self,key,(bool *)((long)&e.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                           ._M_cur + 7));
  if ((e.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
       ._M_cur._7_1_ & 1) == 0) {
    std::vector<long_double,_std::allocator<long_double>_>::operator=(dest,defVal);
  }
  else {
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                           *)&local_38);
    local_48._0_10_ = (longdouble)0;
    StrToNumVectorHelper<std::vector<long_double,std::allocator<long_double>>>
              (&ppVar1->second,dest,&local_48);
  }
  return;
}

Assistant:

void readNumArrHelper(IniProcessing *self, const char *key, TList &dest, const TList &defVal)
{
    bool ok = false;
    IniProcessing::params::IniKeys::iterator e = IniProcessing_readHelper(self, key, ok);

    if(!ok)
    {
        dest = defVal;
        return;
    }

    StrToNumVectorHelper(e->second, dest, static_cast<T>(0));
}